

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpSolver.cc
# Opt level: O1

void __thiscall Minisat::SimpSolver::gatherTouchedClauses(SimpSolver *this)

{
  Queue<unsigned_int> *this_00;
  int iVar1;
  uint uVar2;
  int iVar3;
  uint *puVar4;
  vec<unsigned_int,_int> *pvVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  int local_34;
  
  if (this->n_touched != 0) {
    iVar3 = 0;
    local_34 = 0;
    iVar7 = (this->subsumption_queue).end;
    iVar1 = (this->subsumption_queue).first;
    iVar6 = iVar7 - iVar1;
    if (iVar7 < iVar1) {
      iVar3 = (this->subsumption_queue).buf.sz;
    }
    this_00 = &this->subsumption_queue;
    iVar7 = iVar6 + iVar3;
    if (iVar7 != 0 && SCARRY4(iVar6,iVar3) == iVar7 < 0) {
      do {
        puVar4 = Queue<unsigned_int>::operator[](this_00,local_34);
        if ((this->super_Solver).ca.ra.sz <= *puVar4) goto LAB_001116c4;
        if (((this->super_Solver).ca.ra.memory[*puVar4] & 3) == 0) {
          puVar4 = Queue<unsigned_int>::operator[](this_00,local_34);
          uVar2 = *puVar4;
          if ((this->super_Solver).ca.ra.sz <= uVar2) goto LAB_001116c4;
          puVar4 = (this->super_Solver).ca.ra.memory;
          puVar4[uVar2] = puVar4[uVar2] & 0xfffffffc | 2;
        }
        local_34 = local_34 + 1;
        iVar7 = (this->subsumption_queue).end;
        iVar3 = 0;
        iVar1 = (this->subsumption_queue).first;
        if (iVar7 < iVar1) {
          iVar3 = (this->subsumption_queue).buf.sz;
        }
      } while (local_34 < (iVar7 - iVar1) + iVar3);
    }
    local_34 = 0;
    if (0 < (this->super_Solver).next_var) {
      do {
        if ((this->touched).super_IntMap<int,_char,_Minisat::MkIndexDefault<int>_>.map.sz <=
            local_34) {
LAB_001116e3:
          __assert_fail("has(k)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/luciferxiaozhi[P]VertexCover_CNFSAT_/minisat/minisat/mtl/IntMap.h"
                        ,0x28,
                        "V &Minisat::IntMap<int, char>::operator[](K) [K = int, V = char, MkIndex = Minisat::MkIndexDefault<int>]"
                       );
        }
        if ((this->touched).super_IntMap<int,_char,_Minisat::MkIndexDefault<int>_>.map.data
            [local_34] != '\0') {
          pvVar5 = OccLists<int,_Minisat::vec<unsigned_int,_int>,_Minisat::SimpSolver::ClauseDeleted,_Minisat::MkIndexDefault<int>_>
                   ::lookup(&this->occurs,&local_34);
          if (0 < pvVar5->sz) {
            lVar8 = 0;
            do {
              uVar2 = pvVar5->data[lVar8];
              if ((this->super_Solver).ca.ra.sz <= uVar2) goto LAB_001116c4;
              if (((this->super_Solver).ca.ra.memory[uVar2] & 3) == 0) {
                Queue<unsigned_int>::insert(this_00,uVar2);
                uVar2 = pvVar5->data[lVar8];
                if ((this->super_Solver).ca.ra.sz <= uVar2) goto LAB_001116c4;
                puVar4 = (this->super_Solver).ca.ra.memory;
                puVar4[uVar2] = puVar4[uVar2] & 0xfffffffc | 2;
              }
              lVar8 = lVar8 + 1;
            } while (lVar8 < pvVar5->sz);
          }
          if ((this->touched).super_IntMap<int,_char,_Minisat::MkIndexDefault<int>_>.map.sz <=
              local_34) goto LAB_001116e3;
          (this->touched).super_IntMap<int,_char,_Minisat::MkIndexDefault<int>_>.map.data[local_34]
               = '\0';
        }
        local_34 = local_34 + 1;
      } while (local_34 < (this->super_Solver).next_var);
    }
    iVar3 = 0;
    local_34 = 0;
    iVar7 = (this->subsumption_queue).end;
    iVar1 = (this->subsumption_queue).first;
    iVar6 = iVar7 - iVar1;
    if (iVar7 < iVar1) {
      iVar3 = (this->subsumption_queue).buf.sz;
    }
    iVar7 = iVar6 + iVar3;
    if (iVar7 != 0 && SCARRY4(iVar6,iVar3) == iVar7 < 0) {
      do {
        puVar4 = Queue<unsigned_int>::operator[](this_00,local_34);
        if ((this->super_Solver).ca.ra.sz <= *puVar4) {
LAB_001116c4:
          __assert_fail("r < sz",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/luciferxiaozhi[P]VertexCover_CNFSAT_/minisat/minisat/mtl/Alloc.h"
                        ,0x3f,
                        "T &Minisat::RegionAllocator<unsigned int>::operator[](Ref) [T = unsigned int]"
                       );
        }
        if (((this->super_Solver).ca.ra.memory[*puVar4] & 3) == 2) {
          puVar4 = Queue<unsigned_int>::operator[](this_00,local_34);
          if ((this->super_Solver).ca.ra.sz <= *puVar4) goto LAB_001116c4;
          puVar4 = (this->super_Solver).ca.ra.memory + *puVar4;
          *puVar4 = *puVar4 & 0xfffffffc;
        }
        local_34 = local_34 + 1;
        iVar7 = (this->subsumption_queue).end;
        iVar3 = 0;
        iVar1 = (this->subsumption_queue).first;
        if (iVar7 < iVar1) {
          iVar3 = (this->subsumption_queue).buf.sz;
        }
      } while (local_34 < (iVar7 - iVar1) + iVar3);
    }
    this->n_touched = 0;
  }
  return;
}

Assistant:

void SimpSolver::gatherTouchedClauses()
{
    if (n_touched == 0) return;

    int i,j;
    for (i = j = 0; i < subsumption_queue.size(); i++)
        if (ca[subsumption_queue[i]].mark() == 0)
            ca[subsumption_queue[i]].mark(2);

    for (i = 0; i < nVars(); i++)
        if (touched[i]){
            const vec<CRef>& cs = occurs.lookup(i);
            for (j = 0; j < cs.size(); j++)
                if (ca[cs[j]].mark() == 0){
                    subsumption_queue.insert(cs[j]);
                    ca[cs[j]].mark(2);
                }
            touched[i] = 0;
        }

    for (i = 0; i < subsumption_queue.size(); i++)
        if (ca[subsumption_queue[i]].mark() == 2)
            ca[subsumption_queue[i]].mark(0);

    n_touched = 0;
}